

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.hpp
# Opt level: O1

void __thiscall
sisl::
array_n<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_2,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
::~array_n(array_n<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_2,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
           *this)

{
  int iVar1;
  long lVar2;
  iterator i;
  pointer pMVar3;
  
  iVar1 = 1;
  lVar2 = 2;
  do {
    iVar1 = iVar1 * this->_dims[lVar2 + -2];
    lVar2 = lVar2 + 1;
  } while (lVar2 == 3);
  if (((this->_array != (Matrix<double,__1,_1,_0,__1,_1> *)0x0) &&
      (pMVar3 = this->first, pMVar3 != this->last)) && (iVar1 != 0)) {
    for (; pMVar3 < this->last; pMVar3 = pMVar3 + 1) {
      free((pMVar3->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
          );
    }
    operator_delete(this->first);
  }
  this->_array = (Matrix<double,__1,_1,_0,__1,_1> *)0x0;
  return;
}

Assistant:

~array_n() {
            unsigned int size = 1;
            for(int i = 0; i < N; i++) {
                size *= _dims[i];
            }

            // Check if the array has been allocated in the first place
            if (this->_array != nullptr && first != last && size != 0) {
                for (iterator i = first; i < last; ++i) {
                    Allocator::destroy(i);
                }
                Allocator::deallocate(first, last - first);
            }
            this->_array = nullptr;
        }